

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,TargetType targetType)

{
  bool bVar1;
  ostream *poVar2;
  string local_68;
  string local_48 [8];
  string targetName;
  TargetType targetType_local;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  targetName.field_2._12_4_ = targetType;
  std::__cxx11::string::string(local_48,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_68,target);
  std::__cxx11::string::operator+=(local_48,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar2 = std::operator<<(os,"# Create imported target ");
  poVar2 = std::operator<<(poVar2,local_48);
  std::operator<<(poVar2,"\n");
  switch(targetName.field_2._12_4_) {
  case 0:
    poVar2 = std::operator<<(os,"add_executable(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," IMPORTED)\n");
    break;
  case 1:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," STATIC IMPORTED)\n");
    break;
  case 2:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," SHARED IMPORTED)\n");
    break;
  case 3:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," MODULE IMPORTED)\n");
    break;
  case 4:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," OBJECT IMPORTED)\n");
    break;
  default:
    break;
  case 7:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," INTERFACE IMPORTED)\n");
    break;
  case 8:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," UNKNOWN IMPORTED)\n");
  }
  bVar1 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," PROPERTY ENABLE_EXPORTS 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," PROPERTY FRAMEWORK 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," PROPERTY MACOSX_BUNDLE 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2," PROPERTY BUNDLE 1)\n");
  }
  std::operator<<(os,"\n");
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }
  os << "\n";
}